

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMvMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  int iVar19;
  undefined4 uVar20;
  Geometry *pGVar21;
  RTCFilterFunctionN p_Var22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  AABBNodeMB4D *node1;
  NodeRef *pNVar29;
  ulong uVar30;
  undefined8 uVar31;
  RTCRayN *pRVar32;
  ulong uVar33;
  undefined4 uVar34;
  ulong unaff_RBP;
  size_t mask;
  ulong uVar35;
  ulong uVar36;
  NodeRef *pNVar37;
  ulong uVar38;
  long lVar39;
  bool bVar40;
  float fVar41;
  float fVar45;
  float fVar46;
  undefined1 auVar42 [16];
  float fVar47;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar48;
  float fVar49;
  float fVar54;
  float fVar56;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar55;
  float fVar57;
  float fVar58;
  float fVar59;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar60;
  float fVar63;
  float fVar64;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar65;
  float fVar66;
  float fVar71;
  float fVar72;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar73;
  float fVar74;
  uint uVar75;
  float fVar76;
  uint uVar77;
  float fVar78;
  uint uVar79;
  float fVar80;
  uint uVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  ulong local_a78;
  undefined1 local_9c8 [16];
  ulong local_9b8;
  ulong local_9b0;
  ulong local_9a8;
  ulong local_9a0;
  ulong local_998;
  NodeRef *local_990;
  ulong local_988;
  Scene *local_980;
  undefined1 (*local_978) [16];
  NodeRef *local_970;
  RTCFilterFunctionNArguments args;
  undefined1 local_8c8 [16];
  undefined1 local_8b8 [16];
  float local_8a8 [4];
  float local_898 [4];
  float local_888 [4];
  float local_878 [4];
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  uint local_7f8;
  uint uStack_7f4;
  uint uStack_7f0;
  uint uStack_7ec;
  uint local_7e8;
  uint uStack_7e4;
  uint uStack_7e0;
  uint uStack_7dc;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar13 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar14 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar15 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar16 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar17 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar18 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_998 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_9a0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_9a8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_9b0 = local_998 ^ 0x10;
  uVar38 = local_9a0 ^ 0x10;
  uVar35 = local_9a8 ^ 0x10;
  iVar19 = (tray->tnear).field_0.i[k];
  iVar28 = (tray->tfar).field_0.i[k];
  auVar42._4_4_ = iVar28;
  auVar42._0_4_ = iVar28;
  auVar42._8_4_ = iVar28;
  auVar42._12_4_ = iVar28;
  local_978 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  pNVar29 = stack + 1;
  do {
    local_970 = pNVar29;
    pNVar29 = stack;
    if (local_970 == pNVar29) break;
    local_990 = local_970 + -1;
    pNVar37 = (NodeRef *)local_970[-1].ptr;
    do {
      if (((ulong)pNVar37 & 8) == 0) {
        pNVar29 = (NodeRef *)((ulong)pNVar37 & 0xfffffffffffffff0);
        fVar49 = *(float *)(ray + k * 4 + 0x70);
        pfVar5 = (float *)((long)&pNVar29[0x10].ptr + local_998);
        pfVar4 = (float *)((long)&pNVar29[4].ptr + local_998);
        auVar62._0_4_ = ((*pfVar5 * fVar49 + *pfVar4) - fVar13) * fVar16;
        auVar62._4_4_ = ((pfVar5[1] * fVar49 + pfVar4[1]) - fVar13) * fVar16;
        auVar62._8_4_ = ((pfVar5[2] * fVar49 + pfVar4[2]) - fVar13) * fVar16;
        auVar62._12_4_ = ((pfVar5[3] * fVar49 + pfVar4[3]) - fVar13) * fVar16;
        auVar68._4_4_ = iVar19;
        auVar68._0_4_ = iVar19;
        auVar68._8_4_ = iVar19;
        auVar68._12_4_ = iVar19;
        pfVar5 = (float *)((long)&pNVar29[0x10].ptr + local_9a0);
        pfVar4 = (float *)((long)&pNVar29[4].ptr + local_9a0);
        auVar50 = maxps(auVar68,auVar62);
        auVar67._0_4_ = ((*pfVar5 * fVar49 + *pfVar4) - fVar14) * fVar17;
        auVar67._4_4_ = ((pfVar5[1] * fVar49 + pfVar4[1]) - fVar14) * fVar17;
        auVar67._8_4_ = ((pfVar5[2] * fVar49 + pfVar4[2]) - fVar14) * fVar17;
        auVar67._12_4_ = ((pfVar5[3] * fVar49 + pfVar4[3]) - fVar14) * fVar17;
        pfVar5 = (float *)((long)&pNVar29[0x10].ptr + local_9a8);
        pfVar4 = (float *)((long)&pNVar29[4].ptr + local_9a8);
        auVar61._0_4_ = ((*pfVar5 * fVar49 + *pfVar4) - fVar15) * fVar18;
        auVar61._4_4_ = ((pfVar5[1] * fVar49 + pfVar4[1]) - fVar15) * fVar18;
        auVar61._8_4_ = ((pfVar5[2] * fVar49 + pfVar4[2]) - fVar15) * fVar18;
        auVar61._12_4_ = ((pfVar5[3] * fVar49 + pfVar4[3]) - fVar15) * fVar18;
        auVar68 = maxps(auVar67,auVar61);
        auVar68 = maxps(auVar50,auVar68);
        pfVar5 = (float *)((long)&pNVar29[0x10].ptr + local_9b0);
        pfVar4 = (float *)((long)&pNVar29[4].ptr + local_9b0);
        auVar69._0_4_ = ((*pfVar5 * fVar49 + *pfVar4) - fVar13) * fVar16;
        auVar69._4_4_ = ((pfVar5[1] * fVar49 + pfVar4[1]) - fVar13) * fVar16;
        auVar69._8_4_ = ((pfVar5[2] * fVar49 + pfVar4[2]) - fVar13) * fVar16;
        auVar69._12_4_ = ((pfVar5[3] * fVar49 + pfVar4[3]) - fVar13) * fVar16;
        auVar62 = minps(auVar42,auVar69);
        pfVar1 = (float *)((long)&pNVar29[0x10].ptr + uVar38);
        pfVar4 = (float *)((long)&pNVar29[4].ptr + uVar38);
        pfVar2 = (float *)((long)&pNVar29[0x10].ptr + uVar35);
        pfVar5 = (float *)((long)&pNVar29[4].ptr + uVar35);
        auVar70._0_4_ = ((*pfVar1 * fVar49 + *pfVar4) - fVar14) * fVar17;
        auVar70._4_4_ = ((pfVar1[1] * fVar49 + pfVar4[1]) - fVar14) * fVar17;
        auVar70._8_4_ = ((pfVar1[2] * fVar49 + pfVar4[2]) - fVar14) * fVar17;
        auVar70._12_4_ = ((pfVar1[3] * fVar49 + pfVar4[3]) - fVar14) * fVar17;
        auVar50._4_4_ = ((pfVar2[1] * fVar49 + pfVar5[1]) - fVar15) * fVar18;
        auVar50._0_4_ = ((*pfVar2 * fVar49 + *pfVar5) - fVar15) * fVar18;
        auVar50._8_4_ = ((pfVar2[2] * fVar49 + pfVar5[2]) - fVar15) * fVar18;
        auVar50._12_4_ = ((pfVar2[3] * fVar49 + pfVar5[3]) - fVar15) * fVar18;
        auVar50 = minps(auVar70,auVar50);
        auVar50 = minps(auVar62,auVar50);
        bVar40 = auVar68._0_4_ <= auVar50._0_4_;
        bVar23 = auVar68._4_4_ <= auVar50._4_4_;
        bVar24 = auVar68._8_4_ <= auVar50._8_4_;
        bVar25 = auVar68._12_4_ <= auVar50._12_4_;
        if (((uint)pNVar37 & 7) == 6) {
          bVar40 = (fVar49 < *(float *)&pNVar29[0x1e].ptr && *(float *)&pNVar29[0x1c].ptr <= fVar49)
                   && bVar40;
          bVar23 = (fVar49 < *(float *)((long)&pNVar29[0x1e].ptr + 4) &&
                   *(float *)((long)&pNVar29[0x1c].ptr + 4) <= fVar49) && bVar23;
          bVar24 = (fVar49 < *(float *)&pNVar29[0x1f].ptr && *(float *)&pNVar29[0x1d].ptr <= fVar49)
                   && bVar24;
          bVar25 = (fVar49 < *(float *)((long)&pNVar29[0x1f].ptr + 4) &&
                   *(float *)((long)&pNVar29[0x1d].ptr + 4) <= fVar49) && bVar25;
        }
        auVar51._0_4_ = (uint)bVar40 * -0x80000000;
        auVar51._4_4_ = (uint)bVar23 * -0x80000000;
        auVar51._8_4_ = (uint)bVar24 * -0x80000000;
        auVar51._12_4_ = (uint)bVar25 * -0x80000000;
        uVar34 = movmskps((int)unaff_RBP,auVar51);
        unaff_RBP = CONCAT44((int)(unaff_RBP >> 0x20),uVar34);
      }
      if (((ulong)pNVar37 & 8) == 0) {
        if (unaff_RBP == 0) {
          uVar75 = 4;
        }
        else {
          uVar36 = (ulong)pNVar37 & 0xfffffffffffffff0;
          lVar39 = 0;
          if (unaff_RBP != 0) {
            for (; (unaff_RBP >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
            }
          }
          uVar75 = 0;
          pNVar29 = *(NodeRef **)(uVar36 + lVar39 * 8);
          uVar33 = unaff_RBP - 1 & unaff_RBP;
          pNVar37 = pNVar29;
          if (uVar33 != 0) {
            local_990->ptr = (size_t)pNVar29;
            lVar39 = 0;
            if (uVar33 != 0) {
              for (; (uVar33 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
              }
            }
            uVar30 = uVar33 - 1;
            while( true ) {
              local_990 = local_990 + 1;
              pNVar37 = *(NodeRef **)(uVar36 + lVar39 * 8);
              uVar30 = uVar30 & uVar33;
              if (uVar30 == 0) break;
              local_990->ptr = (size_t)pNVar37;
              lVar39 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> lVar39 & 1) == 0; lVar39 = lVar39 + 1) {
                }
              }
              uVar33 = uVar30 - 1;
            }
            uVar75 = 0;
            pNVar29 = (NodeRef *)0x0;
          }
        }
      }
      else {
        uVar75 = 6;
      }
    } while (uVar75 == 0);
    if (uVar75 == 6) {
      uVar75 = 0;
      local_9b8 = (ulong)((uint)pNVar37 & 0xf) - 8;
      uVar31 = CONCAT71((int7)((ulong)pNVar29 >> 8),local_9b8 != 0);
      if (local_9b8 != 0) {
        uVar33 = (ulong)pNVar37 & 0xfffffffffffffff0;
        uVar36 = 0;
        do {
          lVar39 = uVar36 * 0x140;
          fVar49 = *(float *)(ray + k * 4 + 0x70);
          pfVar5 = (float *)(uVar33 + 0x90 + lVar39);
          pfVar4 = (float *)(uVar33 + lVar39);
          fVar66 = *pfVar5 * fVar49 + *pfVar4;
          fVar71 = pfVar5[1] * fVar49 + pfVar4[1];
          fVar72 = pfVar5[2] * fVar49 + pfVar4[2];
          fVar73 = pfVar5[3] * fVar49 + pfVar4[3];
          pfVar5 = (float *)(uVar33 + 0xa0 + lVar39);
          pfVar4 = (float *)(uVar33 + 0x10 + lVar39);
          fVar60 = *pfVar5 * fVar49 + *pfVar4;
          fVar63 = pfVar5[1] * fVar49 + pfVar4[1];
          fVar64 = pfVar5[2] * fVar49 + pfVar4[2];
          fVar65 = pfVar5[3] * fVar49 + pfVar4[3];
          pfVar5 = (float *)(uVar33 + 0xb0 + lVar39);
          pfVar4 = (float *)(uVar33 + 0x20 + lVar39);
          fVar41 = *pfVar5 * fVar49 + *pfVar4;
          fVar45 = pfVar5[1] * fVar49 + pfVar4[1];
          fVar46 = pfVar5[2] * fVar49 + pfVar4[2];
          fVar47 = pfVar5[3] * fVar49 + pfVar4[3];
          pfVar6 = (float *)(uVar33 + 0xc0 + lVar39);
          pfVar4 = (float *)(uVar33 + 0x30 + lVar39);
          pfVar7 = (float *)(uVar33 + 0xd0 + lVar39);
          pfVar5 = (float *)(uVar33 + 0x40 + lVar39);
          pfVar8 = (float *)(uVar33 + 0xe0 + lVar39);
          pfVar1 = (float *)(uVar33 + 0x50 + lVar39);
          pfVar9 = (float *)(uVar33 + 0xf0 + lVar39);
          pfVar2 = (float *)(uVar33 + 0x60 + lVar39);
          pfVar10 = (float *)(uVar33 + 0x100 + lVar39);
          pfVar3 = (float *)(uVar33 + 0x70 + lVar39);
          pfVar11 = (float *)(uVar33 + 0x110 + lVar39);
          pfVar12 = (float *)(uVar33 + 0x80 + lVar39);
          fVar86 = fVar66 - (*pfVar6 * fVar49 + *pfVar4);
          fVar87 = fVar71 - (pfVar6[1] * fVar49 + pfVar4[1]);
          fVar88 = fVar72 - (pfVar6[2] * fVar49 + pfVar4[2]);
          fVar89 = fVar73 - (pfVar6[3] * fVar49 + pfVar4[3]);
          fVar94 = fVar60 - (*pfVar7 * fVar49 + *pfVar5);
          fVar95 = fVar63 - (pfVar7[1] * fVar49 + pfVar5[1]);
          fVar96 = fVar64 - (pfVar7[2] * fVar49 + pfVar5[2]);
          fVar97 = fVar65 - (pfVar7[3] * fVar49 + pfVar5[3]);
          fVar98 = fVar41 - (*pfVar8 * fVar49 + *pfVar1);
          fVar100 = fVar45 - (pfVar8[1] * fVar49 + pfVar1[1]);
          fVar102 = fVar46 - (pfVar8[2] * fVar49 + pfVar1[2]);
          fVar104 = fVar47 - (pfVar8[3] * fVar49 + pfVar1[3]);
          fVar48 = (*pfVar9 * fVar49 + *pfVar2) - fVar66;
          fVar54 = (pfVar9[1] * fVar49 + pfVar2[1]) - fVar71;
          fVar56 = (pfVar9[2] * fVar49 + pfVar2[2]) - fVar72;
          fVar58 = (pfVar9[3] * fVar49 + pfVar2[3]) - fVar73;
          fVar82 = (*pfVar10 * fVar49 + *pfVar3) - fVar60;
          fVar83 = (pfVar10[1] * fVar49 + pfVar3[1]) - fVar63;
          fVar84 = (pfVar10[2] * fVar49 + pfVar3[2]) - fVar64;
          fVar85 = (pfVar10[3] * fVar49 + pfVar3[3]) - fVar65;
          fVar74 = (fVar49 * *pfVar11 + *pfVar12) - fVar41;
          fVar76 = (fVar49 * pfVar11[1] + pfVar12[1]) - fVar45;
          fVar78 = (fVar49 * pfVar11[2] + pfVar12[2]) - fVar46;
          fVar80 = (fVar49 * pfVar11[3] + pfVar12[3]) - fVar47;
          local_898[0] = fVar98 * fVar82 - fVar94 * fVar74;
          local_898[1] = fVar100 * fVar83 - fVar95 * fVar76;
          local_898[2] = fVar102 * fVar84 - fVar96 * fVar78;
          local_898[3] = fVar104 * fVar85 - fVar97 * fVar80;
          fVar49 = *(float *)(ray + k * 4);
          fVar55 = *(float *)(ray + k * 4 + 0x10);
          fVar57 = *(float *)(ray + k * 4 + 0x40);
          fVar59 = *(float *)(ray + k * 4 + 0x50);
          fVar66 = fVar66 - fVar49;
          fVar71 = fVar71 - fVar49;
          fVar72 = fVar72 - fVar49;
          fVar73 = fVar73 - fVar49;
          fVar60 = fVar60 - fVar55;
          fVar63 = fVar63 - fVar55;
          fVar64 = fVar64 - fVar55;
          fVar65 = fVar65 - fVar55;
          fVar106 = fVar66 * fVar59 - fVar60 * fVar57;
          fVar107 = fVar71 * fVar59 - fVar63 * fVar57;
          fVar108 = fVar72 * fVar59 - fVar64 * fVar57;
          fVar109 = fVar73 * fVar59 - fVar65 * fVar57;
          local_888[0] = fVar86 * fVar74 - fVar98 * fVar48;
          local_888[1] = fVar87 * fVar76 - fVar100 * fVar54;
          local_888[2] = fVar88 * fVar78 - fVar102 * fVar56;
          local_888[3] = fVar89 * fVar80 - fVar104 * fVar58;
          fVar49 = *(float *)(ray + k * 4 + 0x20);
          fVar55 = *(float *)(ray + k * 4 + 0x60);
          fVar41 = fVar41 - fVar49;
          fVar45 = fVar45 - fVar49;
          fVar46 = fVar46 - fVar49;
          fVar47 = fVar47 - fVar49;
          fVar110 = fVar41 * fVar57 - fVar66 * fVar55;
          fVar111 = fVar45 * fVar57 - fVar71 * fVar55;
          fVar112 = fVar46 * fVar57 - fVar72 * fVar55;
          fVar113 = fVar47 * fVar57 - fVar73 * fVar55;
          local_878[0] = fVar94 * fVar48 - fVar86 * fVar82;
          local_878[1] = fVar95 * fVar54 - fVar87 * fVar83;
          local_878[2] = fVar96 * fVar56 - fVar88 * fVar84;
          local_878[3] = fVar97 * fVar58 - fVar89 * fVar85;
          fVar99 = fVar60 * fVar55 - fVar41 * fVar59;
          fVar101 = fVar63 * fVar55 - fVar45 * fVar59;
          fVar103 = fVar64 * fVar55 - fVar46 * fVar59;
          fVar105 = fVar65 * fVar55 - fVar47 * fVar59;
          fVar90 = fVar57 * local_898[0] + fVar59 * local_888[0] + fVar55 * local_878[0];
          fVar91 = fVar57 * local_898[1] + fVar59 * local_888[1] + fVar55 * local_878[1];
          fVar92 = fVar57 * local_898[2] + fVar59 * local_888[2] + fVar55 * local_878[2];
          fVar93 = fVar57 * local_898[3] + fVar59 * local_888[3] + fVar55 * local_878[3];
          uVar75 = (uint)fVar90 & 0x80000000;
          uVar77 = (uint)fVar91 & 0x80000000;
          uVar79 = (uint)fVar92 & 0x80000000;
          uVar81 = (uint)fVar93 & 0x80000000;
          fVar49 = (float)((uint)(fVar48 * fVar99 + fVar82 * fVar110 + fVar74 * fVar106) ^ uVar75);
          fVar55 = (float)((uint)(fVar54 * fVar101 + fVar83 * fVar111 + fVar76 * fVar107) ^ uVar77);
          fVar57 = (float)((uint)(fVar56 * fVar103 + fVar84 * fVar112 + fVar78 * fVar108) ^ uVar79);
          fVar59 = (float)((uint)(fVar58 * fVar105 + fVar85 * fVar113 + fVar80 * fVar109) ^ uVar81);
          fVar74 = (float)((uint)(fVar99 * fVar86 + fVar110 * fVar94 + fVar106 * fVar98) ^ uVar75);
          fVar76 = (float)((uint)(fVar101 * fVar87 + fVar111 * fVar95 + fVar107 * fVar100) ^ uVar77)
          ;
          fVar78 = (float)((uint)(fVar103 * fVar88 + fVar112 * fVar96 + fVar108 * fVar102) ^ uVar79)
          ;
          fVar80 = (float)((uint)(fVar105 * fVar89 + fVar113 * fVar97 + fVar109 * fVar104) ^ uVar81)
          ;
          fVar48 = ABS(fVar90);
          fVar54 = ABS(fVar91);
          fVar56 = ABS(fVar92);
          fVar58 = ABS(fVar93);
          bVar24 = ((0.0 <= fVar74 && 0.0 <= fVar49) && fVar90 != 0.0) && fVar49 + fVar74 <= fVar48;
          bVar25 = ((0.0 <= fVar76 && 0.0 <= fVar55) && fVar91 != 0.0) && fVar55 + fVar76 <= fVar54;
          bVar23 = ((0.0 <= fVar78 && 0.0 <= fVar57) && fVar92 != 0.0) && fVar57 + fVar78 <= fVar56;
          bVar40 = ((0.0 <= fVar80 && 0.0 <= fVar59) && fVar93 != 0.0) && fVar59 + fVar80 <= fVar58;
          uVar34 = (undefined4)((ulong)uVar31 >> 0x20);
          auVar27._4_4_ = -(uint)bVar25;
          auVar27._0_4_ = -(uint)bVar24;
          auVar27._8_4_ = -(uint)bVar23;
          auVar27._12_4_ = -(uint)bVar40;
          iVar28 = movmskps((int)uVar31,auVar27);
          local_a78 = CONCAT44(uVar34,iVar28);
          if (iVar28 != 0) {
            fVar60 = (float)(uVar75 ^ (uint)(fVar66 * local_898[0] +
                                            fVar60 * local_888[0] + fVar41 * local_878[0]));
            fVar63 = (float)(uVar77 ^ (uint)(fVar71 * local_898[1] +
                                            fVar63 * local_888[1] + fVar45 * local_878[1]));
            fVar46 = (float)(uVar79 ^ (uint)(fVar72 * local_898[2] +
                                            fVar64 * local_888[2] + fVar46 * local_878[2]));
            fVar47 = (float)(uVar81 ^ (uint)(fVar73 * local_898[3] +
                                            fVar65 * local_888[3] + fVar47 * local_878[3]));
            fVar41 = *(float *)(ray + k * 4 + 0x30);
            fVar45 = *(float *)(ray + k * 4 + 0x80);
            auVar43._0_4_ =
                 -(uint)((fVar60 <= fVar45 * fVar48 && fVar41 * fVar48 < fVar60) && bVar24);
            auVar43._4_4_ =
                 -(uint)((fVar63 <= fVar45 * fVar54 && fVar41 * fVar54 < fVar63) && bVar25);
            auVar43._8_4_ =
                 -(uint)((fVar46 <= fVar45 * fVar56 && fVar41 * fVar56 < fVar46) && bVar23);
            auVar43._12_4_ =
                 -(uint)((fVar47 <= fVar45 * fVar58 && fVar41 * fVar58 < fVar47) && bVar40);
            iVar28 = movmskps(iVar28,auVar43);
            local_a78 = CONCAT44(uVar34,iVar28);
            if (iVar28 != 0) {
              local_980 = context->scene;
              auVar26._4_4_ = fVar54;
              auVar26._0_4_ = fVar48;
              auVar26._8_4_ = fVar56;
              auVar26._12_4_ = fVar58;
              auVar50 = rcpps(auVar43,auVar26);
              fVar41 = auVar50._0_4_;
              fVar45 = auVar50._4_4_;
              fVar64 = auVar50._8_4_;
              fVar65 = auVar50._12_4_;
              fVar41 = (1.0 - fVar48 * fVar41) * fVar41 + fVar41;
              fVar45 = (1.0 - fVar54 * fVar45) * fVar45 + fVar45;
              fVar64 = (1.0 - fVar56 * fVar64) * fVar64 + fVar64;
              fVar65 = (1.0 - fVar58 * fVar65) * fVar65 + fVar65;
              local_8a8[0] = fVar60 * fVar41;
              local_8a8[1] = fVar63 * fVar45;
              local_8a8[2] = fVar46 * fVar64;
              local_8a8[3] = fVar47 * fVar65;
              local_8c8._0_4_ = fVar49 * fVar41;
              local_8c8._4_4_ = fVar55 * fVar45;
              local_8c8._8_4_ = fVar57 * fVar64;
              local_8c8._12_4_ = fVar59 * fVar65;
              local_8b8._0_4_ = fVar41 * fVar74;
              local_8b8._4_4_ = fVar45 * fVar76;
              local_8b8._8_4_ = fVar64 * fVar78;
              local_8b8._12_4_ = fVar65 * fVar80;
              do {
                uVar30 = 0;
                if (local_a78 != 0) {
                  for (; (local_a78 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                  }
                }
                local_808 = *(uint *)(lVar39 + uVar33 + 0x120 + uVar30 * 4);
                local_988 = (ulong)local_808;
                pGVar21 = (local_980->geometries).items[local_988].ptr;
                if ((pGVar21->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  local_a78 = local_a78 ^ 1L << (uVar30 & 0x3f);
                  bVar40 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar21->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar40 = false;
                }
                else {
                  uVar34 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_838 = *(undefined4 *)(local_8c8 + uVar30 * 4);
                  fVar49 = local_8a8[uVar30 - 4];
                  *(float *)(ray + k * 4 + 0x80) = local_8a8[uVar30];
                  args.context = context->user;
                  uVar20 = *(undefined4 *)(lVar39 + uVar33 + 0x130 + uVar30 * 4);
                  local_818._4_4_ = uVar20;
                  local_818._0_4_ = uVar20;
                  local_818._8_4_ = uVar20;
                  local_818._12_4_ = uVar20;
                  local_828._4_4_ = fVar49;
                  local_828._0_4_ = fVar49;
                  local_828._8_4_ = fVar49;
                  local_828._12_4_ = fVar49;
                  local_868 = local_898[uVar30];
                  local_858 = local_888[uVar30];
                  local_848 = local_878[uVar30];
                  fStack_864 = local_868;
                  fStack_860 = local_868;
                  fStack_85c = local_868;
                  fStack_854 = local_858;
                  fStack_850 = local_858;
                  fStack_84c = local_858;
                  fStack_844 = local_848;
                  fStack_840 = local_848;
                  fStack_83c = local_848;
                  uStack_834 = local_838;
                  uStack_830 = local_838;
                  uStack_82c = local_838;
                  uStack_804 = local_808;
                  uStack_800 = local_808;
                  uStack_7fc = local_808;
                  local_7f8 = (args.context)->instID[0];
                  uStack_7f4 = local_7f8;
                  uStack_7f0 = local_7f8;
                  uStack_7ec = local_7f8;
                  local_7e8 = (args.context)->instPrimID[0];
                  uStack_7e4 = local_7e8;
                  uStack_7e0 = local_7e8;
                  uStack_7dc = local_7e8;
                  local_9c8 = *local_978;
                  args.valid = (int *)local_9c8;
                  args.geometryUserPtr = pGVar21->userPtr;
                  args.hit = (RTCHitN *)&local_868;
                  args.N = 4;
                  pRVar32 = (RTCRayN *)pGVar21->occlusionFilterN;
                  args.ray = (RTCRayN *)ray;
                  if (pRVar32 != (RTCRayN *)0x0) {
                    pRVar32 = (RTCRayN *)(*(code *)pRVar32)(&args);
                  }
                  if (local_9c8 == (undefined1  [16])0x0) {
                    auVar52._8_4_ = 0xffffffff;
                    auVar52._0_8_ = 0xffffffffffffffff;
                    auVar52._12_4_ = 0xffffffff;
                    auVar52 = auVar52 ^ _DAT_01febe20;
                  }
                  else {
                    p_Var22 = context->args->filter;
                    if ((p_Var22 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar21->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var22)(&args);
                    }
                    auVar44._0_4_ = -(uint)(local_9c8._0_4_ == 0);
                    auVar44._4_4_ = -(uint)(local_9c8._4_4_ == 0);
                    auVar44._8_4_ = -(uint)(local_9c8._8_4_ == 0);
                    auVar44._12_4_ = -(uint)(local_9c8._12_4_ == 0);
                    auVar52 = auVar44 ^ _DAT_01febe20;
                    auVar50 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),auVar44
                                      );
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar50;
                    pRVar32 = args.ray;
                  }
                  auVar53._0_4_ = auVar52._0_4_ << 0x1f;
                  auVar53._4_4_ = auVar52._4_4_ << 0x1f;
                  auVar53._8_4_ = auVar52._8_4_ << 0x1f;
                  auVar53._12_4_ = auVar52._12_4_ << 0x1f;
                  iVar28 = movmskps((int)pRVar32,auVar53);
                  bVar40 = iVar28 == 0;
                  if (bVar40) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar34;
                    local_a78 = local_a78 ^ 1L << (uVar30 & 0x3f);
                  }
                }
                uVar75 = 0;
                if (!bVar40) {
                  if ((char)uVar31 != '\0') {
                    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                    uVar75 = 1;
                  }
                  goto LAB_002746da;
                }
              } while (local_a78 != 0);
              local_a78 = 0;
            }
          }
          uVar75 = 0;
          uVar36 = uVar36 + 1;
          uVar31 = CONCAT71((int7)(local_a78 >> 8),uVar36 < local_9b8);
        } while (uVar36 != local_9b8);
      }
    }
LAB_002746da:
    pNVar29 = local_990;
  } while ((uVar75 & 3) == 0);
  return local_970 != stack;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }